

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void lws_destroy_event_pipe(lws *wsi)

{
  int *piVar1;
  lws_event_loop_ops *plVar2;
  _func_void_lws_ptr *p_Var3;
  _func_int_lws_ptr *p_Var4;
  
  _lws_log(8,"%s\n","lws_destroy_event_pipe");
  if ((wsi->desc).sockfd != -1) {
    __remove_wsi_socket_from_fds(wsi);
  }
  plVar2 = wsi->context->event_loop_ops;
  p_Var3 = plVar2->destroy_wsi;
  if (p_Var3 == (_func_void_lws_ptr *)0x0) {
    p_Var4 = plVar2->wsi_logical_close;
    if (p_Var4 != (_func_int_lws_ptr *)0x0) {
      (*p_Var4)(wsi);
      lws_plat_pipe_close(wsi);
      return;
    }
  }
  else {
    (*p_Var3)(wsi);
  }
  lws_plat_pipe_close(wsi);
  piVar1 = &wsi->context->count_wsi_allocated;
  *piVar1 = *piVar1 + -1;
  lws_realloc(wsi,0,"lws_free");
  return;
}

Assistant:

void
lws_destroy_event_pipe(struct lws *wsi)
{
	lwsl_info("%s\n", __func__);

	if (lws_socket_is_valid(wsi->desc.sockfd))
		__remove_wsi_socket_from_fds(wsi);

	if (!wsi->context->event_loop_ops->destroy_wsi &&
	    wsi->context->event_loop_ops->wsi_logical_close) {
		wsi->context->event_loop_ops->wsi_logical_close(wsi);
		lws_plat_pipe_close(wsi);
		return;
	}

	if (wsi->context->event_loop_ops->destroy_wsi)
		wsi->context->event_loop_ops->destroy_wsi(wsi);
	lws_plat_pipe_close(wsi);
	wsi->context->count_wsi_allocated--;
	lws_free(wsi);
}